

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O0

void __thiscall PrintC::emitBlockSwitch(PrintC *this,BlockSwitch *bl)

{
  EmitXml *pEVar1;
  bool bVar2;
  int4 iVar3;
  uint uVar4;
  uint4 uVar5;
  uint uVar6;
  FlowBlock *pFVar7;
  FlowBlock *exp_bl;
  int4 id2;
  int4 id;
  int4 i;
  FlowBlock *bl2;
  BlockSwitch *bl_local;
  PrintC *this_local;
  
  PrintLanguage::pushMod(&this->super_PrintLanguage);
  PrintLanguage::unsetMod(&this->super_PrintLanguage,0x180);
  PrintLanguage::pushMod(&this->super_PrintLanguage);
  PrintLanguage::setMod(&this->super_PrintLanguage,0x80);
  pFVar7 = BlockSwitch::getSwitchBlock(bl);
  (*pFVar7->_vptr_FlowBlock[0xc])(pFVar7,this);
  PrintLanguage::popMod(&this->super_PrintLanguage);
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  PrintLanguage::pushMod(&this->super_PrintLanguage);
  PrintLanguage::setMod(&this->super_PrintLanguage,0x300);
  pFVar7 = BlockSwitch::getSwitchBlock(bl);
  (*pFVar7->_vptr_FlowBlock[0xc])(pFVar7,this);
  PrintLanguage::popMod(&this->super_PrintLanguage);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x21])(pEVar1,1,0);
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"{",8);
  for (id2 = 0; iVar3 = BlockSwitch::getNumCaseBlocks(bl), id2 < iVar3; id2 = id2 + 1) {
    emitSwitchCase(this,id2,bl);
    uVar4 = (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[0x22])();
    uVar5 = BlockSwitch::getGotoType(bl,id2);
    if (uVar5 == 0) {
      pFVar7 = BlockSwitch::getCaseBlock(bl,id2);
      pEVar1 = (this->super_PrintLanguage).emit;
      uVar6 = (*pEVar1->_vptr_EmitXml[6])(pEVar1,pFVar7);
      (*pFVar7->_vptr_FlowBlock[0xc])(pFVar7,this);
      bVar2 = BlockSwitch::isExit(bl,id2);
      if ((bVar2) && (iVar3 = BlockSwitch::getNumCaseBlocks(bl), id2 != iVar3 + -1)) {
        (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
        emitGotoStatement(this,pFVar7,(FlowBlock *)0x0,2);
      }
      pEVar1 = (this->super_PrintLanguage).emit;
      (*pEVar1->_vptr_EmitXml[7])(pEVar1,(ulong)uVar6);
    }
    else {
      (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
      pFVar7 = BlockGraph::getBlock(&bl->super_BlockGraph,0);
      exp_bl = BlockSwitch::getCaseBlock(bl,id2);
      uVar5 = BlockSwitch::getGotoType(bl,id2);
      emitGotoStatement(this,pFVar7,exp_bl,uVar5);
    }
    pEVar1 = (this->super_PrintLanguage).emit;
    (*pEVar1->_vptr_EmitXml[0x23])(pEVar1,(ulong)uVar4);
  }
  (*((this->super_PrintLanguage).emit)->_vptr_EmitXml[8])();
  pEVar1 = (this->super_PrintLanguage).emit;
  (*pEVar1->_vptr_EmitXml[0x19])(pEVar1,"}",8);
  PrintLanguage::popMod(&this->super_PrintLanguage);
  return;
}

Assistant:

void PrintC::emitBlockSwitch(const BlockSwitch *bl)

{
  FlowBlock *bl2;

  pushMod();
  unsetMod(no_branch|only_branch);
  pushMod();
  setMod(no_branch);
  bl->getSwitchBlock()->emit(this);
  popMod();
  emit->tagLine();
  pushMod();
  setMod(only_branch|comma_separate);
  bl->getSwitchBlock()->emit(this);
  popMod();
  emit->spaces(1);
  emit->print("{");

  for(int4 i=0;i<bl->getNumCaseBlocks();++i) {
    emitSwitchCase(i,bl);
    int4 id = emit->startIndent();
    if (bl->getGotoType(i)!=0) {
      emit->tagLine();
      emitGotoStatement(bl->getBlock(0),bl->getCaseBlock(i),bl->getGotoType(i));
    }
    else {
      bl2 = bl->getCaseBlock(i);
      int4 id2 = emit->beginBlock(bl2);
      bl2->emit(this);
      if (bl->isExit(i)&&(i!=bl->getNumCaseBlocks()-1)) {	// Blocks that formally exit the switch
	emit->tagLine();
	emitGotoStatement(bl2,(const FlowBlock *)0,FlowBlock::f_break_goto); // need an explicit break statement
      }
      emit->endBlock(id2);
    }
    emit->stopIndent(id);
  }
  emit->tagLine();
  emit->print("}");
  popMod();
}